

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O3

HPDF_STATUS InternalSaveToStream(HPDF_Doc pdf,HPDF_Stream_conflict stream)

{
  HPDF_STATUS HVar1;
  HPDF_Encrypt e;
  HPDF_Xref xref;
  
  if ((pdf->pdfa_type != HPDF_PDFA_NON_PDFA) && (HVar1 = HPDF_PDFA_AddXmpMetadata(pdf), HVar1 != 0))
  {
    return HVar1;
  }
  HVar1 = HPDF_Stream_WriteStr
                    (stream,HPDF_VERSION_STR_rel +
                            *(int *)(HPDF_VERSION_STR_rel + (ulong)pdf->pdf_version * 4));
  if ((HVar1 != 0) && (HVar1 = (pdf->error).error_no, HVar1 != 0)) {
    return HVar1;
  }
  HVar1 = HPDF_Dict_Add(pdf->trailer,"Root",pdf->catalog);
  if (((HVar1 != 0) || (HVar1 = HPDF_Dict_Add(pdf->trailer,"Info",pdf->info), HVar1 != 0)) &&
     (HVar1 = (pdf->error).error_no, HVar1 != 0)) {
    return HVar1;
  }
  if (pdf->encrypt_on == 0) {
    xref = pdf->xref;
    e = (HPDF_Encrypt)0x0;
  }
  else {
    e = HPDF_EncryptDict_GetAttr(pdf->encrypt_dict);
    HVar1 = HPDF_Doc_PrepareEncryption(pdf);
    if (HVar1 != 0) {
      return HVar1;
    }
    xref = pdf->xref;
  }
  HVar1 = HPDF_Xref_WriteToStream(xref,stream,e);
  if (HVar1 == 0) {
    HVar1 = 0;
  }
  return HVar1;
}

Assistant:

static HPDF_STATUS
InternalSaveToStream  (HPDF_Doc      pdf,
                       HPDF_Stream   stream)
{
    HPDF_STATUS ret;

    /* Add metadata in case of PDF/A document */
    if (pdf->pdfa_type != HPDF_PDFA_NON_PDFA && (ret = HPDF_PDFA_AddXmpMetadata(pdf)) != HPDF_OK)
        return ret;

    if ((ret = WriteHeader (pdf, stream)) != HPDF_OK)
        return ret;

    /* prepare trailer */
    if ((ret = PrepareTrailer (pdf)) != HPDF_OK)
        return ret;

    /* prepare encryption */
    if (pdf->encrypt_on) {
        HPDF_Encrypt e= HPDF_EncryptDict_GetAttr (pdf->encrypt_dict);

        if ((ret = HPDF_Doc_PrepareEncryption (pdf)) != HPDF_OK)
            return ret;

        if ((ret = HPDF_Xref_WriteToStream (pdf->xref, stream, e)) != HPDF_OK)
            return ret;
    } else {
        if ((ret = HPDF_Xref_WriteToStream (pdf->xref, stream, NULL)) !=
                HPDF_OK)
            return ret;
    }

    return HPDF_OK;
}